

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_predictor_4x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  __m128i ww [2];
  __m128i wh [4];
  __m128i pixels [3];
  int in_stack_000002b0;
  longlong local_b8 [4];
  longlong local_98 [8];
  longlong local_58;
  ptrdiff_t in_stack_ffffffffffffffb0;
  uint8_t *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  __m128i *in_stack_ffffffffffffffc8;
  __m128i *in_stack_ffffffffffffffd0;
  __m128i *in_stack_ffffffffffffffd8;
  
  load_pixel_w4(in_RDX,in_RCX,0x10,(__m128i *)&local_58);
  load_weight_w4(0x10,(__m128i *)local_98,(__m128i *)local_b8);
  smooth_pred_4xh(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                  in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                  in_stack_000002b0);
  smooth_pred_4xh(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                  in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                  in_stack_000002b0);
  return;
}

Assistant:

void aom_smooth_predictor_4x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m128i pixels[3];
  load_pixel_w4(above, left, 16, pixels);

  __m128i wh[4], ww[2];
  load_weight_w4(16, wh, ww);

  smooth_pred_4xh(pixels, wh, ww, 8, dst, stride, 0);
  dst += stride << 3;
  smooth_pred_4xh(pixels, &wh[2], ww, 8, dst, stride, 1);
}